

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

string * __thiscall
gflags::anon_unknown_2::CommandLineFlagParser::ProcessFromenvLocked
          (string *__return_storage_ptr__,CommandLineFlagParser *this,string *flagval,
          FlagSettingMode set_mode,bool errors_are_fatal)

{
  CommandLineFlag *pCVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  undefined8 uVar7;
  string local_260;
  allocator local_239;
  key_type local_238;
  string local_218;
  undefined4 local_1f8;
  allocator local_1f1;
  key_type local_1f0;
  allocator local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string envval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string envname;
  key_type local_d0;
  allocator local_a9;
  key_type local_a8;
  string local_88;
  CommandLineFlag *local_68;
  CommandLineFlag *flag;
  char *flagname;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flaglist;
  allocator local_26;
  byte local_25;
  FlagSettingMode local_24;
  bool errors_are_fatal_local;
  string *psStack_20;
  FlagSettingMode set_mode_local;
  string *flagval_local;
  CommandLineFlagParser *this_local;
  string *msg;
  
  local_25 = errors_are_fatal;
  local_24 = set_mode;
  psStack_20 = flagval;
  flagval_local = (string *)this;
  this_local = (CommandLineFlagParser *)__return_storage_ptr__;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    flaglist.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    ParseFlagList(pcVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i);
    for (flagname = (char *)0x0; pcVar4 = flagname,
        pcVar5 = (char *)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&i), pcVar4 < pcVar5; flagname = flagname + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i,(size_type)flagname);
      flag = (CommandLineFlag *)std::__cxx11::string::c_str();
      local_68 = FlagRegistry::FindFlagLocked(this->registry_,(char *)flag);
      if (local_68 == (CommandLineFlag *)0x0) {
        StringPrintf_abi_cxx11_
                  (&local_88,"%sunknown command line flag \'%s\' (via --fromenv or --tryfromenv)\n",
                   "ERROR: ",flag);
        pCVar1 = flag;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a8,(char *)pCVar1,&local_a9);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->error_flags_,&local_a8);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        std::__cxx11::string::~string((string *)&local_88);
        pCVar1 = flag;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_d0,(char *)pCVar1,
                   (allocator *)(envname.field_2._M_local_buf + 0xf));
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->undefined_names_,&local_d0);
        std::__cxx11::string::operator=((string *)pmVar6,"");
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)(envname.field_2._M_local_buf + 0xf));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_118,"FLAGS_",&local_119);
        pCVar1 = flag;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_140,(char *)pCVar1,
                   (allocator *)(envval.field_2._M_local_buf + 0xf));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,&local_118,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator((allocator<char> *)(envval.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        std::__cxx11::string::string((string *)local_168);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar2 = SafeGetEnv(pcVar4,(string *)local_168);
        if (bVar2) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_168,"fromenv");
          if ((bVar2) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_168,"tryfromenv"), pCVar1 = local_68, bVar2)) {
            uVar7 = std::__cxx11::string::c_str();
            StringPrintf_abi_cxx11_
                      (&local_218,"%sinfinite recursion on environment flag \'%s\'\n","ERROR: ",
                       uVar7);
            pCVar1 = flag;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_238,(char *)pCVar1,&local_239);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this->error_flags_,&local_238);
            std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_218);
            std::__cxx11::string::~string((string *)&local_238);
            std::allocator<char>::~allocator((allocator<char> *)&local_239);
            std::__cxx11::string::~string((string *)&local_218);
            local_1f8 = 4;
          }
          else {
            pcVar4 = (char *)std::__cxx11::string::c_str();
            (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                      (&local_260,this,pCVar1,pcVar4,local_24);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_260);
            std::__cxx11::string::~string((string *)&local_260);
            local_1f8 = 0;
          }
        }
        else {
          if ((local_25 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1c8,"ERROR: ",&local_1c9);
            std::operator+(&local_1a8,&local_1c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f8);
            std::operator+(&local_188,&local_1a8," not found in environment\n");
            pCVar1 = flag;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1f0,(char *)pCVar1,&local_1f1);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this->error_flags_,&local_1f0);
            std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_188);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
            std::__cxx11::string::~string((string *)&local_188);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
          }
          local_1f8 = 4;
        }
        std::__cxx11::string::~string((string *)local_168);
        std::__cxx11::string::~string((string *)local_f8);
      }
    }
    flaglist.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    local_1f8 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    if ((flaglist.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  return __return_storage_ptr__;
}

Assistant:

string CommandLineFlagParser::ProcessFromenvLocked(const string& flagval,
                                                   FlagSettingMode set_mode,
                                                   bool errors_are_fatal) {
  if (flagval.empty())
    return "";

  string msg;
  vector<string> flaglist;
  ParseFlagList(flagval.c_str(), &flaglist);

  for (size_t i = 0; i < flaglist.size(); ++i) {
    const char* flagname = flaglist[i].c_str();
    CommandLineFlag* flag = registry_->FindFlagLocked(flagname);
    if (flag == NULL) {
      error_flags_[flagname] =
          StringPrintf("%sunknown command line flag '%s' "
                       "(via --fromenv or --tryfromenv)\n",
                       kError, flagname);
      undefined_names_[flagname] = "";
      continue;
    }

    const string envname = string("FLAGS_") + string(flagname);
    string envval;
    if (!SafeGetEnv(envname.c_str(), envval)) {
      if (errors_are_fatal) {
        error_flags_[flagname] = (string(kError) + envname +
                                  " not found in environment\n");
      }
      continue;
    }

    // Avoid infinite recursion.
    if (envval == "fromenv" || envval == "tryfromenv") {
      error_flags_[flagname] =
          StringPrintf("%sinfinite recursion on environment flag '%s'\n",
                       kError, envval.c_str());
      continue;
    }

    msg += ProcessSingleOptionLocked(flag, envval.c_str(), set_mode);
  }
  return msg;
}